

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-x11.c
# Opt level: O0

errr Infowin_nuke(void)

{
  infowin *iwin;
  
  if (((byte)Infowin->field_0x23 >> 3 & 1) != 0) {
    XDestroyWindow(Metadpy->dpy,Infowin->win);
  }
  return 0;
}

Assistant:

static errr Infowin_nuke(void)
{
	infowin *iwin = Infowin;

	/* Nuke if requested */
	if (iwin->nuke) {
		/* Destory the old window */
		XDestroyWindow(Metadpy->dpy, iwin->win);
	}

	/* Success */
	return (0);
}